

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O2

void __thiscall fanuc_post_processor::generate_LS::First_Part(generate_LS *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_50,"COMMENT\t\t\t= ",&this->comment_);
  std::operator+(&local_70,&local_50,";");
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_50,"PROG_SIZE\t\t= ",&this->prog_size_);
  std::operator+(&local_70,&local_50,";");
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_50,"FILE_NAME\t\t= ",&this->file_name_);
  std::operator+(&local_70,&local_50,";");
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_50,"VERSION\t\t\t= ",&this->version_);
  std::operator+(&local_70,&local_50,";");
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::to_string(&local_30,this->line_cnt);
  std::operator+(&local_50,"LINE_COUNT\t\t= ",&local_30);
  std::operator+(&local_70,&local_50,";");
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_50,"MEMORY_SIZE\t\t= ",&this->memory_size_);
  std::operator+(&local_70,&local_50,";");
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  return;
}

Assistant:

void generate_LS::First_Part() {
        // PROG
        program.append("/PROG ");
        program.append(program_name_);
        program.append("\n");
        // ATTR
        program.append("/ATTR");
        program.append("\n");
        program.append("OWNER\t\t\t= MNEDITOR;");
        program.append("\n");
        program.append("COMMENT\t\t\t= " + comment_ +";");
        program.append("\n");
        program.append("PROG_SIZE\t\t= " + prog_size_ + ";");
        program.append("\n");
//        program.append("CREATE\t\t\t= DATE 21-03-18  TIME 13:17:58;");
//        program.append("\n");
//        program.append("MODIFIED\t\t= DATE 21-03-18  TIME 14:10:54;");
//        program.append("\n");
        program.append("FILE_NAME\t\t= " + file_name_ + ";");
        program.append("\n");
        program.append("VERSION\t\t\t= " + version_ + ";");
        program.append("\n");
        program.append("LINE_COUNT\t\t= " + std::to_string(line_cnt) + ";");
        program.append("\n");
        program.append("MEMORY_SIZE\t\t= " + memory_size_ + ";");
        program.append("\n");
        program.append("PROTECT\t\t\t= READ_WRITE;");
        program.append("\n");
        program.append("TCD:  STACK_SIZE\t\t= 0,\n"
                       "      TASK_PRIORITY\t\t= 50,\n"
                       "      TIME_SLICE\t\t= 0,\n"
                       "      BUSY_LAMP_OFF\t\t= 0,\n"
                       "      ABORT_REQUEST\t\t= 0,\n"
                       "      PAUSE_REQUEST\t\t= 0;");
        program.append("\n");
        program.append("DEFAULT_GROUP\t= 1,*,*,*,*;");
        program.append("\n");
        program.append("CONTROL_CODE\t= 00000000 00000000;");
        program.append("\n");

//        //APPL
//        program.append("/APPL\n");
//        program.append("  SPOT : TRUE ;");
//        program.append("\n");
//        program.append("\n");
//        program.append("AUTO_SINGULARITY_HEADER;");
//        program.append("\n");
//        program.append("  ENABLE_SINGULARITY_AVOIDANCE   : FALSE;");
//        program.append("\n");
//        program.append("  SPOT Welding Equipment Number : 1 ;");
//        program.append("\n");

        //MN
        program.append("/MN");
        program.append("\n");
        program.append("\t1:  UFRAME_NUM=0 ;");
        program.append("\n");
        program.append("\t2:  UTOOL_NUM=1 ;");
        program.append("\n");
    }